

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

long CalculateTruncatedMedian<long>(vector<long,_std::allocator<long>_> *scores)

{
  long lVar1;
  pointer plVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (long)(scores->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(scores->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar5 == 0) {
    lVar3 = 0;
  }
  else {
    std::
    __sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ();
    uVar4 = (ulong)((long)uVar5 >> 3) >> 1;
    plVar2 = (scores->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((uVar5 & 8) == 0) {
      lVar3 = (plVar2[uVar4] + plVar2[uVar4 - 1]) / 2;
    }
    else {
      lVar3 = plVar2[uVar4];
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return lVar3;
  }
  __stack_chk_fail();
}

Assistant:

static T CalculateTruncatedMedian(std::vector<T>& scores)
{
    size_t size = scores.size();
    if (size == 0) {
        return 0;
    }

    std::sort(scores.begin(), scores.end());
    if (size % 2 == 0) {
        return (scores[size / 2 - 1] + scores[size / 2]) / 2;
    } else {
        return scores[size / 2];
    }
}